

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcess.cpp
# Opt level: O0

void ac::core::detail::rgba2yuva<float,float>(Image *src,Image *dsty,Image *dstuva)

{
  Image *in_stack_00000058;
  Image *in_stack_00000060;
  Image *in_stack_00000068;
  anon_class_1_0_00000001 *in_stack_00000070;
  
  filter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_src_ImageProcess_cpp:158:16),_const_ac::core::Image,_ac::core::Image,_ac::core::Image,_true>
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

inline void rgba2yuva(const Image& src, Image& dsty, Image& dstuva)
    {
        filter([](const int /*i*/, const int /*j*/, const void* const sptr, void* const yptr, void* const uvaptr) {
            auto in = static_cast<const IN*>(sptr);
            auto yout = static_cast<OUT*>(yptr);
            auto uvaout = static_cast<OUT*>(uvaptr);

            float r = toFloat(in[0]);
            float g = toFloat(in[1]);
            float b = toFloat(in[2]);

            float y = 0.299f * r + 0.587f * g + 0.114f * b;
            float u = 0.564f * (b - y) + 0.5f;
            float v = 0.713f * (r - y) + 0.5f;

            yout[0] = fromFloat<OUT>(y);
            uvaout[0] = fromFloat<OUT>(u);
            uvaout[1] = fromFloat<OUT>(v);
            if constexpr (std::is_same_v<IN, OUT>) uvaout[2] = in[3];
            else uvaout[2] = fromFloat<OUT>(toFloat(in[3]));
        }, src, dsty, dstuva);
    }